

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O2

void __thiscall helics::ipc::OwnedQueue::~OwnedQueue(OwnedQueue *this)

{
  if ((this->rqueue)._M_t.
      super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      .
      super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
      ._M_head_impl !=
      (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->connectionName)._M_dataplus._M_p);
  }
  if ((this->queue_state)._M_t.
      super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
      .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl !=
      (shared_memory_object *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->stateName)._M_dataplus._M_p);
  }
  CLI::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&this->buffer);
  std::__cxx11::string::~string((string *)&this->errorString);
  std::__cxx11::string::~string((string *)&this->stateName);
  std::__cxx11::string::~string((string *)&this->connectionName);
  std::__cxx11::string::~string((string *)&this->connectionNameOrig);
  std::
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::~unique_ptr(&this->queue_state);
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&this->rqueue);
  return;
}

Assistant:

OwnedQueue::~OwnedQueue()
    {
        if (rqueue) {
            ipc_queue::remove(connectionName.c_str());
        }
        if (queue_state) {
            ipc_state::remove(stateName.c_str());
        }
    }